

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSC32.h
# Opt level: O0

int SetPWMSSC32(SSC32 *pSSC32,int channel,int pw)

{
  int iVar1;
  size_t sVar2;
  uint local_240;
  uint local_23c;
  uint local_238;
  uint8 local_228 [4];
  int sendbuflen;
  char sendbuf [512];
  uint local_20;
  int pw_local;
  int channel_local;
  SSC32 *pSSC32_local;
  
  if (pSSC32->bProportionalPWs[channel] == 0) {
    local_20 = (int)(pSSC32->CoefPWs[channel] * (double)(pw + -0x5dc)) + 0x5dc;
  }
  else {
    iVar1 = (int)(pSSC32->CoefPWs[channel] * (double)(pw + -0x5dc));
    if (iVar1 < 0) {
      local_20 = pSSC32->MidPWs[channel] +
                 (iVar1 * (pSSC32->MinPWs[channel] - pSSC32->MidPWs[channel])) / -500;
    }
    else {
      local_20 = pSSC32->MidPWs[channel] +
                 (iVar1 * (pSSC32->MaxPWs[channel] - pSSC32->MidPWs[channel])) / 500;
    }
  }
  if ((int)local_20 < pSSC32->MaxPWs[channel]) {
    local_238 = local_20;
  }
  else {
    local_238 = pSSC32->MaxPWs[channel];
  }
  if (pSSC32->MinPWs[channel] < (int)local_238) {
    if ((int)local_20 < pSSC32->MaxPWs[channel]) {
      local_23c = local_20;
    }
    else {
      local_23c = pSSC32->MaxPWs[channel];
    }
    local_240 = local_23c;
  }
  else {
    local_240 = pSSC32->MinPWs[channel];
  }
  iVar1 = local_240 - pSSC32->LastPWs[channel];
  if (iVar1 < 1) {
    iVar1 = -iVar1;
  }
  if (iVar1 < pSSC32->ThresholdPWs[channel]) {
    pSSC32_local._4_4_ = 0;
  }
  else {
    memset(local_228,0,0x200);
    sprintf((char *)local_228,"#%dP%d\r",(ulong)(uint)channel,(ulong)local_240);
    sVar2 = strlen((char *)local_228);
    iVar1 = WriteDataSSC32(pSSC32,local_228,(int)sVar2,pSSC32->bytedelayus);
    if (iVar1 == 0) {
      if ((pSSC32->bSaveRawData != 0) && (pSSC32->pfSaveFile != (FILE *)0x0)) {
        fwrite(local_228,(long)(int)sVar2,1,(FILE *)pSSC32->pfSaveFile);
        fflush((FILE *)pSSC32->pfSaveFile);
      }
      pSSC32->LastPWs[channel] = local_240;
      pSSC32_local._4_4_ = 0;
    }
    else {
      printf("Error writing data to a SSC32. \n");
      pSSC32_local._4_4_ = 1;
    }
  }
  return pSSC32_local._4_4_;
}

Assistant:

inline int SetPWMSSC32(SSC32* pSSC32, int channel, int pw)
{
	char sendbuf[MAX_NB_BYTES_SSC32];
	int sendbuflen = 0;

	if (pSSC32->bProportionalPWs[channel])
	{
		pw = (int)(pSSC32->CoefPWs[channel]*(pw-DEFAULT_MID_PW_SSC32));
		if (pw >= 0)
			pw = pSSC32->MidPWs[channel]+pw*(pSSC32->MaxPWs[channel]-pSSC32->MidPWs[channel])
			/(DEFAULT_MAX_PW_SSC32-DEFAULT_MID_PW_SSC32);
		else
			pw = pSSC32->MidPWs[channel]+pw*(pSSC32->MinPWs[channel]-pSSC32->MidPWs[channel])
			/(DEFAULT_MIN_PW_SSC32-DEFAULT_MID_PW_SSC32);
	}
	else
	{
		pw = DEFAULT_MID_PW_SSC32+(int)(pSSC32->CoefPWs[channel]*(pw-DEFAULT_MID_PW_SSC32));
	}

	pw = max(min(pw, pSSC32->MaxPWs[channel]), pSSC32->MinPWs[channel]);
	//pw = max(min(pw, DEFAULT_ABSOLUTE_MAX_PW_SSC32), DEFAULT_ABSOLUTE_MIN_PW_SSC32);

	// The requested PWM is only applied if it is slightly different from the current value.
	if (abs(pw-pSSC32->LastPWs[channel]) < pSSC32->ThresholdPWs[channel]) return EXIT_SUCCESS;

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	sprintf(sendbuf, "#%dP%d\r", channel, pw);
	sendbuflen = (int)strlen(sendbuf);

	if (WriteDataSSC32(pSSC32, (unsigned char*)sendbuf, sendbuflen, pSSC32->bytedelayus) != EXIT_SUCCESS)
	{
		printf("Error writing data to a SSC32. \n");
		return EXIT_FAILURE;
	}
	if ((pSSC32->bSaveRawData)&&(pSSC32->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pSSC32->pfSaveFile);
		fflush(pSSC32->pfSaveFile);
	}

	// Update last known value.
	pSSC32->LastPWs[channel] = pw;

	return EXIT_SUCCESS;
}